

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

string * __thiscall
ListPanel::writeXml_abi_cxx11_(string *__return_storage_ptr__,ListPanel *this,int indent)

{
  int indent_00;
  ostream *poVar1;
  int level;
  int level_00;
  stringstream str;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  Util::getIndent_abi_cxx11_(&local_290,(Util *)(ulong)(uint)indent,level);
  poVar1 = std::operator<<(local_1a0,(string *)&local_290);
  std::operator<<(poVar1,"<ListPanel");
  std::__cxx11::string::~string((string *)&local_290);
  Widget::writeXmlAttributes(&this->super_Widget,(stringstream *)local_1b0);
  poVar1 = std::operator<<(local_1a0,">");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)&local_1d0,"ScrollBarVisibility",(allocator *)&local_290);
  indent_00 = indent + 1;
  Util::writeXmlElement<ScrollBarVisibility>
            ((stringstream *)local_1b0,indent_00,&local_1d0,this->scrollBarVisibility);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_1f0,"ShowItemBorder",(allocator *)&local_290);
  Util::writeXmlElement<ScrollBarVisibility>
            ((stringstream *)local_1b0,indent_00,&local_1f0,this->scrollBarVisibility);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string((string *)&local_210,"ShowSection",(allocator *)&local_290);
  Util::writeXmlElement<ScrollBarVisibility>
            ((stringstream *)local_1b0,indent_00,&local_210,this->scrollBarVisibility);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string((string *)&local_230,"ShowEmptySection",(allocator *)&local_290);
  Util::writeXmlElement<ScrollBarVisibility>
            ((stringstream *)local_1b0,indent_00,&local_230,this->scrollBarVisibility);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_250,"ListPanelItemName",(allocator *)&local_290);
  std::__cxx11::string::string((string *)&local_270,(string *)&this->listPanelItemName);
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1b0,indent_00,&local_250,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  Widget::writeXmlChildren(&this->super_Widget,(stringstream *)local_1b0,indent_00);
  Util::getIndent_abi_cxx11_(&local_290,(Util *)(ulong)(uint)indent,level_00);
  poVar1 = std::operator<<(local_1a0,(string *)&local_290);
  std::operator<<(poVar1,"</ListPanel>");
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string ListPanel::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<ListPanel";
	writeXmlAttributes(str);
	str << ">" << std::endl;

	Util::writeXmlElement(str, indent + 1, "ScrollBarVisibility", scrollBarVisibility);
	Util::writeXmlElement(str, indent + 1, "ShowItemBorder", scrollBarVisibility);
	Util::writeXmlElement(str, indent + 1, "ShowSection", scrollBarVisibility);
	Util::writeXmlElement(str, indent + 1, "ShowEmptySection", scrollBarVisibility);
	Util::writeXmlElement(str, indent + 1, "ListPanelItemName", listPanelItemName);

	writeXmlChildren(str, indent + 1);
	
	str << Util::getIndent(indent) << "</ListPanel>";
	return str.str();
}